

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<6144,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  Blob<128> h;
  keytype k;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  undefined4 in_stack_fffffffffffffcb8;
  byte bVar5;
  undefined4 in_stack_fffffffffffffcbc;
  uint8_t in_stack_fffffffffffffcc7;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  pfHash in_stack_fffffffffffffcd0;
  undefined1 local_328 [195];
  uint8_t in_stack_fffffffffffffd9b;
  uint8_t in_stack_fffffffffffffd9c;
  uint8_t in_stack_fffffffffffffd9d;
  uint8_t in_stack_fffffffffffffd9e;
  uint8_t in_stack_fffffffffffffd9f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_fffffffffffffda0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x1800,pcVar4,(ulong)in_ESI);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x15cddf);
  Blob<6144>::Blob((Blob<6144> *)local_328);
  memset(local_328,0,0x300);
  if ((local_d & 1) != 0) {
    Blob<128>::Blob((Blob<128> *)&stack0xfffffffffffffcbc);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(local_328,0x300,0,&stack0xfffffffffffffcbc);
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX),
               (value_type *)CONCAT44(in_ECX,in_R8D));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<6144>,Blob<128>>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
             (bool)in_stack_fffffffffffffcc7,
             (Blob<6144> *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX));
  sVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<Blob<128>>
                    (in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffd9f,
                     (bool)in_stack_fffffffffffffd9e,(bool)in_stack_fffffffffffffd9d,
                     (bool)in_stack_fffffffffffffd9c,(bool)in_stack_fffffffffffffd9b);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}